

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O0

int __thiscall helics::FederateState::checkInterfaces(FederateState *this)

{
  string_view message;
  string_view message_00;
  string_view logMessageSource;
  string_view logMessageSource_00;
  bool bVar1;
  reference pvVar2;
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_RDI;
  undefined1 in_stack_00000060 [16];
  string_view in_stack_00000070;
  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *issue
  ;
  iterator __end1;
  iterator __begin1;
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range1;
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  issues;
  InterfaceInfo *in_stack_00000170;
  undefined4 in_stack_fffffffffffffdf8;
  undefined4 in_stack_fffffffffffffdfc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *x;
  char local_1d8 [32];
  __sv_type local_1b8;
  __sv_type local_1a8;
  char *local_198;
  undefined8 local_190;
  undefined1 local_188 [32];
  __sv_type local_168;
  __sv_type local_158;
  reference local_148;
  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_140;
  __normal_iterator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_130;
  undefined4 local_114;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  int local_ec;
  undefined1 local_e8 [16];
  undefined8 local_d8;
  undefined1 *local_d0;
  char *local_c8;
  undefined8 uStack_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b8;
  char *local_b0;
  undefined8 uStack_a8;
  undefined1 *local_a0;
  int local_98 [8];
  undefined8 local_78;
  int *local_70;
  char *local_68;
  undefined8 in_stack_ffffffffffffffa0;
  FederateState *in_stack_ffffffffffffffa8;
  reference in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  size_t in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  
  InterfaceInfo::checkInterfacesForIssues_abi_cxx11_(in_stack_00000170);
  bVar1 = std::
          vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::empty(in_RDI);
  if (bVar1) {
    local_ec = 0;
  }
  else {
    x = &local_110;
    pvVar2 = std::
             vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::front((vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)in_stack_fffffffffffffe00);
    *(int *)&in_RDI[0x1c].
             super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start = pvVar2->first;
    std::
    vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::front((vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)in_stack_fffffffffffffe00);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (in_stack_fffffffffffffe00,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
    local_130 = &local_110;
    local_138._M_current =
         (pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)std::
            vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::begin((vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
    local_140 = (pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)std::
                   vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::end((vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
    while( true ) {
      bVar1 = __gnu_cxx::
              operator==<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        ((__normal_iterator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          *)in_stack_fffffffffffffe00,
                         (__normal_iterator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      local_148 = __gnu_cxx::
                  __normal_iterator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  ::operator*(&local_138);
      if (local_148->first == -2) {
        local_158 = std::__cxx11::string::operator_cast_to_basic_string_view
                              (in_stack_fffffffffffffe00);
        local_198 = "Connection Error: {}";
        local_190 = 0x14;
        local_b8 = &local_148->second;
        local_a0 = local_188;
        local_b0 = "Connection Error: {}";
        uStack_a8 = 0x14;
        local_c8 = "Connection Error: {}";
        uStack_c0 = 0x14;
        ::fmt::v11::detail::value<fmt::v11::context>::
        value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
                  ((value<fmt::v11::context> *)in_RDI,x);
        local_d0 = local_e8;
        local_d8 = 0xd;
        ::fmt::v11::vformat_abi_cxx11_(in_stack_00000070,(format_args)in_stack_00000060);
        local_168 = std::__cxx11::string::operator_cast_to_basic_string_view
                              (in_stack_fffffffffffffe00);
        in_stack_fffffffffffffdf8 = 0;
        logMessageSource._M_str = in_stack_ffffffffffffffc8;
        logMessageSource._M_len = in_stack_ffffffffffffffc0;
        message._M_str = in_stack_ffffffffffffffb8;
        message._M_len = (size_t)in_stack_ffffffffffffffb0;
        logMessage(in_stack_ffffffffffffffa8,(int)((ulong)in_stack_ffffffffffffffa0 >> 0x20),
                   logMessageSource,message,SUB81((ulong)in_stack_ffffffffffffffa0 >> 0x18,0));
        std::__cxx11::string::~string(in_stack_fffffffffffffe00);
      }
      else {
        local_1a8 = std::__cxx11::string::operator_cast_to_basic_string_view
                              (in_stack_fffffffffffffe00);
        in_stack_ffffffffffffffa8 = (FederateState *)&local_148->second;
        in_stack_ffffffffffffffc8 = local_1d8;
        in_stack_ffffffffffffffb8 = "error code {}: {}";
        in_stack_ffffffffffffffc0 = 0x11;
        local_68 = "error code {}: {}";
        in_stack_ffffffffffffffa0 = 0;
        local_98[0] = local_148->first;
        in_stack_ffffffffffffffb0 = local_148;
        ::fmt::v11::detail::value<fmt::v11::context>::
        value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
                  ((value<fmt::v11::context> *)in_RDI,x);
        local_70 = local_98;
        local_78 = 0xd1;
        ::fmt::v11::vformat_abi_cxx11_(in_stack_00000070,(format_args)in_stack_00000060);
        local_1b8 = std::__cxx11::string::operator_cast_to_basic_string_view
                              (in_stack_fffffffffffffe00);
        in_stack_fffffffffffffdf8 = 0;
        logMessageSource_00._M_str = in_stack_ffffffffffffffc8;
        logMessageSource_00._M_len = in_stack_ffffffffffffffc0;
        message_00._M_str = in_stack_ffffffffffffffb8;
        message_00._M_len = (size_t)in_stack_ffffffffffffffb0;
        logMessage(in_stack_ffffffffffffffa8,(int)((ulong)in_stack_ffffffffffffffa0 >> 0x20),
                   logMessageSource_00,message_00,SUB81((ulong)in_stack_ffffffffffffffa0 >> 0x18,0))
        ;
        std::__cxx11::string::~string(in_stack_fffffffffffffe00);
      }
      __gnu_cxx::
      __normal_iterator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::operator++(&local_138);
    }
    local_ec = *(int *)&in_RDI[0x1c].
                        super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
  }
  local_114 = 1;
  std::
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(in_RDI);
  return local_ec;
}

Assistant:

int FederateState::checkInterfaces()
{
    auto issues = interfaceInformation.checkInterfacesForIssues();
    if (issues.empty()) {
        return 0;
    }
    errorCode = issues.front().first;
    errorString = issues.front().second;
    for (auto& issue : issues) {
        switch (issue.first) {
            case defs::Errors::CONNECTION_FAILURE:
                LOG_ERROR(fmt::format("Connection Error: {}", issue.second));
                break;
            default:
                LOG_ERROR(fmt::format("error code {}: {}", issue.first, issue.second));
                break;
        }
    }
    return errorCode;
}